

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilSort.c
# Opt level: O2

void Abc_QuickSortTest(void)

{
  int iVar1;
  abctime aVar2;
  word *pData;
  word *pData_00;
  abctime aVar3;
  abctime time;
  abctime time_00;
  abctime time_01;
  long lVar4;
  ulong uVar5;
  
  aVar2 = Abc_Clock();
  pData = (word *)malloc(8000000);
  pData_00 = (word *)malloc(8000000);
  srand(0x457);
  uVar5 = 0;
  for (lVar4 = 0; lVar4 != 1000000; lVar4 = lVar4 + 1) {
    iVar1 = rand();
    pData[lVar4] = (long)iVar1 | uVar5;
    pData_00[lVar4] = (long)iVar1 | uVar5;
    uVar5 = uVar5 + 0x100000000;
  }
  aVar3 = Abc_Clock();
  Abc_PrintTime(0x7ed692,(char *)(aVar3 - aVar2),time);
  aVar2 = Abc_Clock();
  Abc_QuickSort3(pData,1000000,1);
  aVar3 = Abc_Clock();
  Abc_PrintTime(0x7ed69b,(char *)(aVar3 - aVar2),time_00);
  aVar2 = Abc_Clock();
  Abc_QuickSort1(pData_00,1000000,1);
  aVar3 = Abc_Clock();
  Abc_PrintTime(0x7ed6a4,(char *)(aVar3 - aVar2),time_01);
  free(pData);
  free(pData_00);
  return;
}

Assistant:

void Abc_QuickSortTest()
{
    int nSize = 1000000;
    int fVerbose = 0;
    word * pData1, * pData2;
    int i;
    abctime clk = Abc_Clock();
    // generate numbers
    pData1 = ABC_ALLOC( word, nSize );
    pData2 = ABC_ALLOC( word, nSize );
    srand( 1111 );
    for ( i = 0; i < nSize; i++ )
        pData2[i] = pData1[i] = ((word)i << 32) | rand();
    Abc_PrintTime( 1, "Prepare ", Abc_Clock() - clk );
    // perform sorting
    clk = Abc_Clock();
    Abc_QuickSort3( pData1, nSize, 1 );
    Abc_PrintTime( 1, "Sort new", Abc_Clock() - clk );
    // print the result
    if ( fVerbose )
    {
        for ( i = 0; i < nSize; i++ )
            printf( "(%d,%d) ", (int)(pData1[i] >> 32), (int)pData1[i] );
        printf( "\n" );
    }
    // create new numbers
    clk = Abc_Clock();
    Abc_QuickSort1( pData2, nSize, 1 );
    Abc_PrintTime( 1, "Sort old", Abc_Clock() - clk );
    // print the result
    if ( fVerbose )
    {
        for ( i = 0; i < nSize; i++ )
            printf( "(%d,%d) ", (int)(pData2[i] >> 32), (int)pData2[i] );
        printf( "\n" );
    }
    ABC_FREE( pData1 );
    ABC_FREE( pData2 );
}